

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

int buildMap(TIFFRGBAImage *img)

{
  ushort uVar1;
  TIFF *tif;
  int iVar2;
  char *module;
  TIFFRGBAImage *img_local;
  
  uVar1 = img->photometric;
  if (1 < uVar1) {
    if (uVar1 != 2) {
      if (uVar1 == 3) {
        iVar2 = checkcmap(img);
        if (iVar2 == 0x10) {
          cvtcmap(img);
        }
        else {
          tif = img->tif;
          module = TIFFFileName(img->tif);
          TIFFWarningExtR(tif,module,"Assuming 8-bit colormap");
        }
        if (8 < img->bitspersample) {
          return 1;
        }
        iVar2 = makecmap(img);
        if (iVar2 != 0) {
          return 1;
        }
        return 0;
      }
      if (uVar1 != 5 && uVar1 != 6) {
        return 1;
      }
    }
    if (img->bitspersample == 8) {
      return 1;
    }
  }
  iVar2 = setupMap(img);
  if (iVar2 != 0) {
    return 1;
  }
  return 0;
}

Assistant:

static int buildMap(TIFFRGBAImage *img)
{
    switch (img->photometric)
    {
        case PHOTOMETRIC_RGB:
        case PHOTOMETRIC_YCBCR:
        case PHOTOMETRIC_SEPARATED:
            if (img->bitspersample == 8)
                break;
            /* fall through... */
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_MINISWHITE:
            if (!setupMap(img))
                return (0);
            break;
        case PHOTOMETRIC_PALETTE:
            /*
             * Convert 16-bit colormap to 8-bit (unless it looks
             * like an old-style 8-bit colormap).
             */
            if (checkcmap(img) == 16)
                cvtcmap(img);
            else
                TIFFWarningExtR(img->tif, TIFFFileName(img->tif),
                                "Assuming 8-bit colormap");
            /*
             * Use mapping table and colormap to construct
             * unpacking tables for samples < 8 bits.
             */
            if (img->bitspersample <= 8 && !makecmap(img))
                return (0);
            break;
    }
    return (1);
}